

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O2

RefCntAutoPtr<Diligent::RenderDeviceVkImpl> * __thiscall
Diligent::RefCntAutoPtr<Diligent::RenderDeviceVkImpl>::operator=
          (RefCntAutoPtr<Diligent::RenderDeviceVkImpl> *this,RenderDeviceVkImpl *pObj)

{
  RenderDeviceVkImpl *this_00;
  
  this_00 = this->m_pObject;
  if (this_00 != pObj) {
    if (this_00 != (RenderDeviceVkImpl *)0x0) {
      RefCountedObject<Diligent::IRenderDeviceVk>::Release
                ((RefCountedObject<Diligent::IRenderDeviceVk> *)this_00);
    }
    this->m_pObject = pObj;
    if (pObj != (RenderDeviceVkImpl *)0x0) {
      RefCountedObject<Diligent::IRenderDeviceVk>::AddRef
                ((RefCountedObject<Diligent::IRenderDeviceVk> *)pObj);
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }